

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sOcclusionQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Stress::OcclusionQueryStressCase::OcclusionQueryStressCase
          (OcclusionQueryStressCase *this,Context *ctx,char *name,char *desc,int numOccluderDraws,
          int numOccludersPerDraw,int numTargetDraws,int numTargetsPerDraw,int numQueries,
          deUint32 queryMode)

{
  deUint32 seed;
  
  tcu::TestCase::TestCase((TestCase *)this,ctx->m_testCtx,name,desc);
  (this->super_TestCase).m_context = ctx;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__OcclusionQueryStressCase_00d17f58;
  this->m_numOccluderDraws = numOccluderDraws;
  this->m_numOccludersPerDraw = numOccludersPerDraw;
  this->m_numTargetDraws = numTargetDraws;
  this->m_numTargetsPerDraw = numTargetsPerDraw;
  this->m_numQueries = numQueries;
  this->m_queryMode = queryMode;
  this->m_renderCtx = ctx->m_renderCtx;
  this->m_program = (ShaderProgram *)0x0;
  this->m_iterNdx = 0;
  seed = deStringHash(name);
  deRandom_init(&(this->m_rnd).m_rnd,seed);
  return;
}

Assistant:

OcclusionQueryStressCase::OcclusionQueryStressCase (Context& ctx, const char* name, const char* desc, int numOccluderDraws, int numOccludersPerDraw, int numTargetDraws, int numTargetsPerDraw, int numQueries, deUint32 queryMode)
	: TestCase				(ctx, name, desc)
	, m_numOccluderDraws	(numOccluderDraws)
	, m_numOccludersPerDraw	(numOccludersPerDraw)
	, m_numTargetDraws		(numTargetDraws)
	, m_numTargetsPerDraw	(numTargetsPerDraw)
	, m_numQueries			(numQueries)
	, m_queryMode			(queryMode)
	, m_renderCtx			(ctx.getRenderContext())
	, m_program				(DE_NULL)
	, m_iterNdx				(0)
	, m_rnd					(deStringHash(name))
{
}